

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O0

Vec_Int_t * Abc_GraphGrid(int n)

{
  Vec_Int_t *p;
  int local_20;
  int local_1c;
  int k;
  int i;
  Vec_Int_t *vEdges;
  int n_local;
  
  p = Vec_IntAlloc(n * 4 * (n + -1));
  local_1c = 0;
  while( true ) {
    if (n <= local_1c) {
      return p;
    }
    for (local_20 = 0; local_20 < n + -1; local_20 = local_20 + 1) {
      Vec_IntPushTwo(p,local_1c * n + local_20,local_1c * n + local_20 + 1);
    }
    if (local_1c == n + -1) break;
    for (local_20 = 0; local_20 < n; local_20 = local_20 + 1) {
      Vec_IntPushTwo(p,local_1c * n + local_20,local_1c * n + local_20 + n);
    }
    local_1c = local_1c + 1;
  }
  return p;
}

Assistant:

Vec_Int_t * Abc_GraphGrid( int n )
{
    Vec_Int_t * vEdges = Vec_IntAlloc( 4*n*(n-1) ); // two nodes per edge
    int i, k;
    for ( i = 0; i < n; i++ )
    {
        for ( k = 0; k < n-1; k++ )
            Vec_IntPushTwo( vEdges, i*n+k, i*n+k+1 );
        if ( i == n-1 ) break;
        for ( k = 0; k < n; k++ )
            Vec_IntPushTwo( vEdges, i*n+k, i*n+k+n );
    }
    //Vec_IntPrint( vEdges );
    return vEdges;
}